

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::truncateCommonTrace(Exception *this)

{
  uint uVar1;
  uint in_ECX;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint j;
  ulong uVar6;
  int iVar7;
  ArrayPtr<void_*const> AVar8;
  void *refTraceSpace [36];
  kj akStack_138 [288];
  
  if (this->isFullTrace == true) {
    this->isFullTrace = false;
    if (this->traceCount != 0) {
      memset(akStack_138,0,0x120);
      AVar8 = getStackTrace(akStack_138,(ArrayPtr<void_*>)ZEXT816(0x24),in_ECX);
      uVar4 = AVar8.size_;
      if ((int)AVar8.size_ != 0) {
        uVar1 = this->traceCount;
        uVar3 = uVar4 >> 1;
        uVar5 = uVar4 & 0xffffffff;
        do {
          if (AVar8.ptr[uVar5 - 1] == this->trace[uVar1 - 1]) {
            iVar7 = -1;
            uVar6 = 0;
            do {
              if (uVar1 == uVar6) {
                uVar2 = 0;
LAB_00444464:
                this->traceCount = uVar2;
                return;
              }
              if (uVar3 < uVar6 &&
                  AVar8.ptr[(uint)((int)uVar4 + iVar7)] != this->trace[uVar1 + iVar7]) {
                uVar2 = uVar1 - (int)uVar6;
                goto LAB_00444464;
              }
              uVar6 = uVar6 + 1;
              iVar7 = iVar7 + -1;
            } while (uVar5 != uVar6);
          }
          uVar5 = uVar5 - 1;
          uVar4 = uVar4 - 1;
        } while (uVar5 != 0);
      }
    }
  }
  return;
}

Assistant:

void Exception::truncateCommonTrace() {
  if (isFullTrace) {
    // We're truncating the common portion of the full trace, turning it back into a limited
    // trace.
    isFullTrace = false;
  } else {
    // If the trace was never extended in the first place, trying to truncate it is at best a waste
    // of time and at worst might remove information for no reason. So, don't.
    //
    // This comes up in particular in coroutines, when the exception originated from a co_awaited
    // promise. In that case we manually add the one relevant frame to the trace, rather than
    // call extendTrace() just to have to truncate most of it again a moment later in the
    // unhandled_exception() callback.
    return;
  }

  if (traceCount > 0) {
    // Create a "reference" stack trace that is a little bit deeper than the one in the exception.
    void* refTraceSpace[sizeof(this->trace) / sizeof(this->trace[0]) + 4]{};
    auto refTrace = kj::getStackTrace(refTraceSpace, 0);

    // We expect that the deepest frame in the exception's stack trace should be somewhere in our
    // own trace, since our own trace has a deeper limit. Search for it.
    for (uint i = refTrace.size(); i > 0; i--) {
      if (refTrace[i-1] == trace[traceCount-1]) {
        // See how many frames match.
        for (uint j = 0; j < i; j++) {
          if (j >= traceCount) {
            // We matched the whole trace, apparently?
            traceCount = 0;
            return;
          } else if (refTrace[i-j-1] != trace[traceCount-j-1]) {
            // Found mismatching entry.

            // If we matched more than half of the reference trace, guess that this is in fact
            // the prefix we're looking for.
            if (j > refTrace.size() / 2) {
              // Delete the matching suffix.
              traceCount -= j;
              return;
            }
          }
        }
      }
    }

    // No match. Ignore.
  }
}